

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::DestroyImage::DestroyImage
          (DestroyImage *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,bool useSync,
          bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DestroyImage_003eb000;
  (this->m_image).m_ptr = image->m_ptr;
  pSVar2 = image->m_state;
  (this->m_image).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_image).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  local_28.m_ptr = &image->m_ptr->super_Object;
  local_28.m_state = image->m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.m_ptr = (Object *)0x0;
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_28.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_28.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

DestroyImage::DestroyImage (SharedPtr<EGLImage> image, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
	, m_image	(image)
{
	modifyGLObject(SharedPtr<Object>(image));
}